

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O2

void wallet::UnloadWallets(WalletContext *context)

{
  pointer psVar1;
  long in_FS_OFFSET;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  value_type wallet;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  wallets;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_68;
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> local_50;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets(&local_40,context);
  while (local_40.
         super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_40.
         super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &local_40.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>);
    psVar1 = local_40.
             super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_40.
    super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_40.
         super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(psVar1->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    local_68.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RemoveWallet(context,(shared_ptr<wallet::CWallet> *)&local_50,(optional<bool>)0x0,&local_68);
    WaitForDeleteWallet((shared_ptr<wallet::CWallet> *)&local_50);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::~vector(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnloadWallets(WalletContext& context)
{
    auto wallets = GetWallets(context);
    while (!wallets.empty()) {
        auto wallet = wallets.back();
        wallets.pop_back();
        std::vector<bilingual_str> warnings;
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt, warnings);
        WaitForDeleteWallet(std::move(wallet));
    }
}